

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O2

void test_bus_validate_peer(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_stat *pnVar4;
  uint64_t uVar5;
  nng_stat *local_30;
  nng_stat *stats;
  nng_socket s2;
  nng_socket s1;
  
  nuts_scratch_addr("inproc",0x40,test_bus_validate_peer::nuts_addr_);
  nVar1 = nng_bus0_open((nng_socket *)((long)&stats + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x70,"%s: expected success, got %s (%d)","nng_bus0_open(&s1)",pcVar3,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_pair0_open((nng_socket *)&stats);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x71,"%s: expected success, got %s (%d)","nng_pair0_open(&s2)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_listen(stats._4_4_,test_bus_validate_peer::nuts_addr_,(nng_listener *)0x0,0);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x73,"%s: expected success, got %s (%d)",
                             "nng_listen(s1, addr, NULL, 0)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_dial(stats._0_4_,test_bus_validate_peer::nuts_addr_,(nng_dialer *)0x0,2);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0x74,"%s: expected success, got %s (%d)",
                               "nng_dial(s2, addr, NULL, NNG_FLAG_NONBLOCK)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nuts_sleep(100);
          nVar1 = nng_stats_get(&local_30);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0x77,"%s: expected success, got %s (%d)","nng_stats_get(&stats)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            acutest_check_((uint)(local_30 != (nng_stat *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x79,"%s","stats != NULL");
            pnVar4 = nng_stat_find_socket(local_30,stats._4_4_);
            acutest_check_((uint)(pnVar4 != (nng_stat *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x7a,"%s","(reject = nng_stat_find_socket(stats, s1)) != NULL");
            pnVar4 = nng_stat_find(pnVar4,"reject");
            acutest_check_((uint)(pnVar4 != (nng_stat *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x7b,"%s","(reject = nng_stat_find(reject, \"reject\")) != NULL");
            iVar2 = nng_stat_type(pnVar4);
            acutest_check_((uint)(iVar2 == 2),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x7d,"%s","nng_stat_type(reject) == NNG_STAT_COUNTER");
            uVar5 = nng_stat_value(pnVar4);
            acutest_check_((uint)(uVar5 != 0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x7e,"%s","nng_stat_value(reject) > 0");
            nVar1 = nng_socket_close(stats._4_4_);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                   ,0x80,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_socket_close(stats._0_4_);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                     ,0x81,"%s: expected success, got %s (%d)",
                                     "nng_socket_close(s2)",pcVar3,nVar1);
              if (iVar2 != 0) {
                nng_stats_free(local_30);
                return;
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bus_validate_peer(void)
{
	nng_socket      s1, s2;
	nng_stat       *stats;
	const nng_stat *reject;
	char           *addr;

	NUTS_ADDR(addr, "inproc");
	NUTS_PASS(nng_bus0_open(&s1));
	NUTS_PASS(nng_pair0_open(&s2));

	NUTS_PASS(nng_listen(s1, addr, NULL, 0));
	NUTS_PASS(nng_dial(s2, addr, NULL, NNG_FLAG_NONBLOCK));

	NUTS_SLEEP(100);
	NUTS_PASS(nng_stats_get(&stats));

	NUTS_TRUE(stats != NULL);
	NUTS_TRUE((reject = nng_stat_find_socket(stats, s1)) != NULL);
	NUTS_TRUE((reject = nng_stat_find(reject, "reject")) != NULL);

	NUTS_TRUE(nng_stat_type(reject) == NNG_STAT_COUNTER);
	NUTS_TRUE(nng_stat_value(reject) > 0);

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	nng_stats_free(stats);
}